

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * Curl_cache_addr(SessionHandle *data,Curl_addrinfo *addr,char *hostname,int port)

{
  char *__s;
  size_t sVar1;
  undefined8 *p;
  Curl_dns_entry *pCVar2;
  
  __s = create_hostcache_id(hostname,port);
  if (__s == (char *)0x0) {
    return (Curl_dns_entry *)0x0;
  }
  sVar1 = strlen(__s);
  p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
  if (p != (undefined8 *)0x0) {
    p[2] = 0;
    *p = addr;
    time(p + 1);
    if (p[1] == 0) {
      p[1] = 1;
    }
    pCVar2 = (Curl_dns_entry *)Curl_hash_add((data->dns).hostcache,__s,sVar1 + 1,p);
    if (pCVar2 != (Curl_dns_entry *)0x0) {
      pCVar2->inuse = pCVar2->inuse + 1;
      goto LAB_00474254;
    }
    (*Curl_cfree)(p);
  }
  pCVar2 = (Curl_dns_entry *)0x0;
LAB_00474254:
  (*Curl_cfree)(__s);
  return pCVar2;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct SessionHandle *data,
                Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char *entry_id;
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return NULL;
  entry_len = strlen(entry_id);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    free(entry_id);
    return NULL;
  }

  dns->inuse = 0;   /* init to not used */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates that entry isn't in hash table */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len+1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    free(entry_id);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */

  /* free the allocated entry_id */
  free(entry_id);

  return dns;
}